

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_table_column_metadata
              (sqlite3 *db,char *zDbName,char *zTableName,char *zColumnName,char **pzDataType,
              char **pzCollSeq,int *pNotNull,int *pPrimaryKey,int *pAutoinc)

{
  int iVar1;
  char *zFormat;
  bool local_89;
  Column *local_88;
  uint local_7c;
  uint local_78;
  int autoinc;
  int primarykey;
  int notnull;
  char *zCollSeq;
  char *zDataType;
  Column *pCStack_58;
  int iCol;
  Column *pCol;
  Table *pTab;
  char *zErrMsg;
  char **ppcStack_38;
  int rc;
  char **pzCollSeq_local;
  char **pzDataType_local;
  char *zColumnName_local;
  char *zTableName_local;
  char *zDbName_local;
  sqlite3 *db_local;
  
  pTab = (Table *)0x0;
  pCol = (Column *)0x0;
  pCStack_58 = (Column *)0x0;
  zDataType._4_4_ = 0;
  zCollSeq = (char *)0x0;
  _primarykey = (char *)0x0;
  autoinc = 0;
  local_78 = 0;
  local_7c = 0;
  ppcStack_38 = pzCollSeq;
  pzCollSeq_local = pzDataType;
  pzDataType_local = (char **)zColumnName;
  zColumnName_local = zTableName;
  zTableName_local = zDbName;
  zDbName_local = (char *)db;
  sqlite3_mutex_enter(db->mutex);
  sqlite3BtreeEnterAll((sqlite3 *)zDbName_local);
  zErrMsg._4_4_ = sqlite3Init((sqlite3 *)zDbName_local,(char **)&pTab);
  if (zErrMsg._4_4_ == 0) {
    pCol = (Column *)sqlite3FindTable((sqlite3 *)zDbName_local,zColumnName_local,zTableName_local);
    if (((Table *)pCol == (Table *)0x0) || (((Table *)pCol)->eTabType == '\x02')) {
      pCol = (Column *)0x0;
    }
    else {
      if (pzDataType_local != (char **)0x0) {
        for (zDataType._4_4_ = 0; zDataType._4_4_ < ((Table *)pCol)->nCol;
            zDataType._4_4_ = zDataType._4_4_ + 1) {
          pCStack_58 = ((Table *)pCol)->aCol + zDataType._4_4_;
          iVar1 = sqlite3StrICmp(pCStack_58->zCnName,(char *)pzDataType_local);
          if (iVar1 == 0) break;
        }
        if (zDataType._4_4_ == ((Table *)pCol)->nCol) {
          if (((((Table *)pCol)->tabFlags & 0x80) != 0) ||
             (iVar1 = sqlite3IsRowid((char *)pzDataType_local), iVar1 == 0)) {
            pCol = (Column *)0x0;
            goto LAB_00134483;
          }
          zDataType._4_4_ = (int)((Table *)pCol)->iPKey;
          if (zDataType._4_4_ < 0) {
            local_88 = (Column *)0x0;
          }
          else {
            local_88 = ((Table *)pCol)->aCol + zDataType._4_4_;
          }
          pCStack_58 = local_88;
        }
      }
      if (pCStack_58 == (Column *)0x0) {
        zCollSeq = "INTEGER";
        local_78 = 1;
      }
      else {
        zCollSeq = sqlite3ColumnType(pCStack_58,(char *)0x0);
        _primarykey = sqlite3ColumnColl(pCStack_58);
        autoinc = (int)((pCStack_58->field_0x8 & 0xf) != 0);
        local_78 = (uint)((pCStack_58->colFlags & 1) != 0);
        local_89 = false;
        if (((Table *)pCol)->iPKey == zDataType._4_4_) {
          local_89 = (((Table *)pCol)->tabFlags & 8) != 0;
        }
        local_7c = (uint)local_89;
      }
      if (_primarykey == (char *)0x0) {
        _primarykey = "BINARY";
      }
    }
  }
LAB_00134483:
  sqlite3BtreeLeaveAll((sqlite3 *)zDbName_local);
  if (pzCollSeq_local != (char **)0x0) {
    *pzCollSeq_local = zCollSeq;
  }
  if (ppcStack_38 != (char **)0x0) {
    *ppcStack_38 = _primarykey;
  }
  if (pNotNull != (int *)0x0) {
    *pNotNull = autoinc;
  }
  if (pPrimaryKey != (int *)0x0) {
    *pPrimaryKey = local_78;
  }
  if (pAutoinc != (int *)0x0) {
    *pAutoinc = local_7c;
  }
  if ((zErrMsg._4_4_ == 0) && (pCol == (Column *)0x0)) {
    sqlite3DbFree((sqlite3 *)zDbName_local,pTab);
    pTab = (Table *)sqlite3MPrintf((sqlite3 *)zDbName_local,"no such table column: %s.%s",
                                   zColumnName_local,pzDataType_local);
    zErrMsg._4_4_ = 1;
  }
  zFormat = (char *)0x0;
  if (pTab != (Table *)0x0) {
    zFormat = "%s";
  }
  sqlite3ErrorWithMsg((sqlite3 *)zDbName_local,zErrMsg._4_4_,zFormat,pTab);
  sqlite3DbFree((sqlite3 *)zDbName_local,pTab);
  zErrMsg._4_4_ = sqlite3ApiExit((sqlite3 *)zDbName_local,zErrMsg._4_4_);
  sqlite3_mutex_leave(*(sqlite3_mutex **)(zDbName_local + 0x18));
  return zErrMsg._4_4_;
}

Assistant:

SQLITE_API int sqlite3_table_column_metadata(
  sqlite3 *db,                /* Connection handle */
  const char *zDbName,        /* Database name or NULL */
  const char *zTableName,     /* Table name */
  const char *zColumnName,    /* Column name */
  char const **pzDataType,    /* OUTPUT: Declared data type */
  char const **pzCollSeq,     /* OUTPUT: Collation sequence name */
  int *pNotNull,              /* OUTPUT: True if NOT NULL constraint exists */
  int *pPrimaryKey,           /* OUTPUT: True if column part of PK */
  int *pAutoinc               /* OUTPUT: True if column is auto-increment */
){
  int rc;
  char *zErrMsg = 0;
  Table *pTab = 0;
  Column *pCol = 0;
  int iCol = 0;
  char const *zDataType = 0;
  char const *zCollSeq = 0;
  int notnull = 0;
  int primarykey = 0;
  int autoinc = 0;


#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zTableName==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif

  /* Ensure the database schema has been loaded */
  sqlite3_mutex_enter(db->mutex);
  sqlite3BtreeEnterAll(db);
  rc = sqlite3Init(db, &zErrMsg);
  if( SQLITE_OK!=rc ){
    goto error_out;
  }

  /* Locate the table in question */
  pTab = sqlite3FindTable(db, zTableName, zDbName);
  if( !pTab || IsView(pTab) ){
    pTab = 0;
    goto error_out;
  }

  /* Find the column for which info is requested */
  if( zColumnName==0 ){
    /* Query for existance of table only */
  }else{
    for(iCol=0; iCol<pTab->nCol; iCol++){
      pCol = &pTab->aCol[iCol];
      if( 0==sqlite3StrICmp(pCol->zCnName, zColumnName) ){
        break;
      }
    }
    if( iCol==pTab->nCol ){
      if( HasRowid(pTab) && sqlite3IsRowid(zColumnName) ){
        iCol = pTab->iPKey;
        pCol = iCol>=0 ? &pTab->aCol[iCol] : 0;
      }else{
        pTab = 0;
        goto error_out;
      }
    }
  }

  /* The following block stores the meta information that will be returned
  ** to the caller in local variables zDataType, zCollSeq, notnull, primarykey
  ** and autoinc. At this point there are two possibilities:
  **
  **     1. The specified column name was rowid", "oid" or "_rowid_"
  **        and there is no explicitly declared IPK column.
  **
  **     2. The table is not a view and the column name identified an
  **        explicitly declared column. Copy meta information from *pCol.
  */
  if( pCol ){
    zDataType = sqlite3ColumnType(pCol,0);
    zCollSeq = sqlite3ColumnColl(pCol);
    notnull = pCol->notNull!=0;
    primarykey  = (pCol->colFlags & COLFLAG_PRIMKEY)!=0;
    autoinc = pTab->iPKey==iCol && (pTab->tabFlags & TF_Autoincrement)!=0;
  }else{
    zDataType = "INTEGER";
    primarykey = 1;
  }
  if( !zCollSeq ){
    zCollSeq = sqlite3StrBINARY;
  }

error_out:
  sqlite3BtreeLeaveAll(db);

  /* Whether the function call succeeded or failed, set the output parameters
  ** to whatever their local counterparts contain. If an error did occur,
  ** this has the effect of zeroing all output parameters.
  */
  if( pzDataType ) *pzDataType = zDataType;
  if( pzCollSeq ) *pzCollSeq = zCollSeq;
  if( pNotNull ) *pNotNull = notnull;
  if( pPrimaryKey ) *pPrimaryKey = primarykey;
  if( pAutoinc ) *pAutoinc = autoinc;

  if( SQLITE_OK==rc && !pTab ){
    sqlite3DbFree(db, zErrMsg);
    zErrMsg = sqlite3MPrintf(db, "no such table column: %s.%s", zTableName,
        zColumnName);
    rc = SQLITE_ERROR;
  }
  sqlite3ErrorWithMsg(db, rc, (zErrMsg?"%s":0), zErrMsg);
  sqlite3DbFree(db, zErrMsg);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}